

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_callback.cpp
# Opt level: O1

int fooid(double *v)

{
  ostream *poVar1;
  runtime_error *this;
  ostringstream oss;
  string local_1b0 [32];
  ostringstream local_190 [376];
  
  if ((*v == 10.0) && (!NAN(*v))) {
    fooid_called = true;
    return 0;
  }
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Error ",6);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,
             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/function/test/test_callback.cpp"
             ,0x74);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,":",1);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)local_190,0x1a);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," v==10.0",8);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this,local_1b0);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int fooid(double const &v)
{
	TEST(v==10.0);
	fooid_called = true;
	return 0;
}